

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::InitializeFromParent(cmStateSnapshot *this)

{
  __buckets_ptr pp_Var1;
  cmLinkedTree<cmDefinitions> *pcVar2;
  StackIter begin;
  StackIter end;
  PointerType pSVar3;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var4;
  PointerType pBVar5;
  PointerType pBVar6;
  PointerType pBVar7;
  PointerType pBVar8;
  char *value;
  PositionType *this_00;
  PositionType parent;
  iterator local_78;
  undefined1 local_68 [56];
  
  this_00 = &this->Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  local_78.Tree = (pSVar3->DirectoryParent).Tree;
  local_78.Position = (pSVar3->DirectoryParent).Position;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar2 = (pSVar3->Vars).Tree;
  if ((pcVar2 == (cmLinkedTree<cmDefinitions> *)0x0) ||
     ((ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) <
      (pSVar3->Vars).Position)) {
    __assert_fail("this->Position->Vars.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateSnapshot.cxx"
                  ,0x172,"void cmStateSnapshot::InitializeFromParent()");
  }
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
  pcVar2 = (pSVar3->Vars).Tree;
  if ((pcVar2 != (cmLinkedTree<cmDefinitions> *)0x0) &&
     ((pSVar3->Vars).Position <=
      (ulong)(((long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pcVar2->Data).
                     super__Vector_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7))) {
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    begin.Tree = (pSVar3->Vars).Tree;
    begin.Position = (pSVar3->Vars).Position;
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    end.Tree = (pSVar3->Root).Tree;
    end.Position = (pSVar3->Root).Position;
    cmDefinitions::MakeClosure((cmDefinitions *)local_68,begin,end);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    p_Var4 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)cmLinkedTree<cmDefinitions>::iterator::operator*(&pSVar3->Vars);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign(p_Var4,local_68);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDefinitions::Def>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_68);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar5->IncludeDirectories,&pBVar6->IncludeDirectories,
               &pBVar7->IncludeDirectoryBacktraces,&pBVar8->IncludeDirectoryBacktraces,
               &pSVar3->IncludeDirectoryPosition);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar5->CompileDefinitions,&pBVar6->CompileDefinitions,
               &pBVar7->CompileDefinitionsBacktraces,&pBVar8->CompileDefinitionsBacktraces,
               &pSVar3->CompileDefinitionsPosition);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar5->CompileOptions,&pBVar6->CompileOptions,&pBVar7->CompileOptionsBacktraces,
               &pBVar8->CompileOptionsBacktraces,&pSVar3->CompileOptionsPosition);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar5->LinkOptions,&pBVar6->LinkOptions,&pBVar7->LinkOptionsBacktraces,
               &pBVar8->LinkOptionsBacktraces,&pSVar3->LinkOptionsPosition);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
              (&pBVar5->LinkDirectories,&pBVar6->LinkDirectories,&pBVar7->LinkDirectoriesBacktraces,
               &pBVar8->LinkDirectoriesBacktraces,&pSVar3->LinkDirectoriesPosition);
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_78);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    pp_Var1 = (__buckets_ptr)(local_68 + 0x10);
    local_68._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"INCLUDE_REGULAR_EXPRESSION","");
    value = cmPropertyMap::GetPropertyValue(&pBVar5->Properties,(string *)local_68);
    if ((__buckets_ptr)local_68._0_8_ != pp_Var1) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pBVar5 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&pSVar3->BuildSystemDirectory);
    local_68._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"INCLUDE_REGULAR_EXPRESSION","");
    cmPropertyMap::SetProperty(&pBVar5->Properties,(string *)local_68,value);
    if ((__buckets_ptr)local_68._0_8_ != pp_Var1) {
      operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    }
    return;
  }
  __assert_fail("parent->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmStateSnapshot.cxx"
                ,0x173,"void cmStateSnapshot::InitializeFromParent()");
}

Assistant:

void cmStateSnapshot::InitializeFromParent()
{
  cmStateDetail::PositionType parent = this->Position->DirectoryParent;
  assert(this->Position->Vars.IsValid());
  assert(parent->Vars.IsValid());

  *this->Position->Vars =
    cmDefinitions::MakeClosure(parent->Vars, parent->Root);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->IncludeDirectories,
    this->Position->BuildSystemDirectory->IncludeDirectories,
    parent->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->BuildSystemDirectory->IncludeDirectoryBacktraces,
    this->Position->IncludeDirectoryPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileDefinitions,
    this->Position->BuildSystemDirectory->CompileDefinitions,
    parent->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->BuildSystemDirectory->CompileDefinitionsBacktraces,
    this->Position->CompileDefinitionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->CompileOptions,
    this->Position->BuildSystemDirectory->CompileOptions,
    parent->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->BuildSystemDirectory->CompileOptionsBacktraces,
    this->Position->CompileOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkOptions,
    this->Position->BuildSystemDirectory->LinkOptions,
    parent->BuildSystemDirectory->LinkOptionsBacktraces,
    this->Position->BuildSystemDirectory->LinkOptionsBacktraces,
    this->Position->LinkOptionsPosition);

  InitializeContentFromParent(
    parent->BuildSystemDirectory->LinkDirectories,
    this->Position->BuildSystemDirectory->LinkDirectories,
    parent->BuildSystemDirectory->LinkDirectoriesBacktraces,
    this->Position->BuildSystemDirectory->LinkDirectoriesBacktraces,
    this->Position->LinkDirectoriesPosition);

  const char* include_regex =
    parent->BuildSystemDirectory->Properties.GetPropertyValue(
      "INCLUDE_REGULAR_EXPRESSION");
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", include_regex);
}